

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.hpp
# Opt level: O2

void __thiscall duckdb::CatalogEntryRetriever::~CatalogEntryRetriever(CatalogEntryRetriever *this)

{
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->search_path).internal.
              super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  ::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

explicit CatalogEntryRetriever(ClientContext &context) : context(context) {
	}